

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall
SAT::explainToExhaustion
          (SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  vec<Lit> *other;
  vec<int> *other_00;
  char *pcVar1;
  uint uVar2;
  Clause *this_00;
  ostream *poVar3;
  ulong uVar4;
  Lit *pLVar5;
  uint j;
  uint i;
  int in_stack_ffffffffffffff4c;
  Lit q;
  vec<char> local_80;
  vec<int> local_70;
  vec<Lit> local_60;
  int local_50 [8];
  
  vec<char>::vec<char>(&local_80,&this->seen);
  other = &this->out_learnt;
  vec<Lit>::vec<Lit>(&local_60,other);
  other_00 = &this->out_learnt_level;
  vec<int>::vec<int>(&local_70,other_00);
  uVar2 = 0;
  do {
    while( true ) {
      if (other->sz <= uVar2) {
        vec<char>::moveTo(&local_80,&this->seen);
        vec<Lit>::moveTo(&local_60,other);
        vec<int>::moveTo(&local_70,other_00);
        free(local_70.data);
        free(local_60.data);
        free(local_80.data);
        return;
      }
      this_00 = getExpl(this,(Lit)((this->out_learnt).data[uVar2].x ^ 1));
      if (so.debug == true) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"checking literal ");
        getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
        poVar3 = std::operator<<(poVar3,(string *)local_50);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)local_50);
      }
      if (this_00 == (Clause *)0x0) break;
      if ((*(uint *)this_00 & 1) != 0) {
        uVar4 = (ulong)(*(uint *)this_00 >> 8);
        this_00[1].data[uVar4 - 1].x = this_00[1].data[uVar4 - 1].x + 1;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   contributingNogoods,&this_00[1].data[uVar4].x);
      }
      pLVar5 = (this->out_learnt).data;
      pLVar5[uVar2].x = pLVar5[(this->out_learnt).sz - 1].x;
      (this->out_learnt).sz = (this->out_learnt).sz - 1;
      (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
      for (i = 1; i < *(uint *)this_00 >> 8; i = i + 1) {
        pLVar5 = Clause::operator[](this_00,i);
        q.x = pLVar5->x;
        if (so.debug == true) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"adding literal ");
          getLitString_abi_cxx11_(in_stack_ffffffffffffff4c);
          std::operator<<(poVar3,(string *)local_50);
          std::__cxx11::string::~string((string *)local_50);
        }
        pcVar1 = (this->seen).data;
        if (pcVar1[(uint)(q.x >> 1)] == '\0') {
          pcVar1[(uint)(q.x >> 1)] = '\x01';
          vec<Lit>::push(other,&q);
          local_50[0] = getLevel(this,q.x >> 1);
          vec<int>::push(other_00,local_50);
        }
        else if (so.debug == true) {
          std::operator<<((ostream *)&std::cerr," but already seen it");
        }
        if (so.debug == true) {
          std::operator<<((ostream *)&std::cerr,"\n");
        }
      }
    }
    if (so.debug == true) {
      std::operator<<((ostream *)&std::cerr,"it has no reason\n");
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void SAT::explainToExhaustion(std::set<int>& contributingNogoods) {
	vec<char> oldseen(seen);
	vec<Lit> old_out_learnt(out_learnt);
	vec<int> old_out_learnt_level(out_learnt_level);

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		assert(!reason[var(p)].isLazy());
		Clause* cp = getExpl(~p);
		if (so.debug) {
			std::cerr << "checking literal " << getLitString(toInt(~p)) << "\n";
		}
		if (cp == nullptr) {
			if (so.debug) {
				std::cerr << "it has no reason\n";
			}
			continue;
		}
		Clause& c = *cp;
		if (c.learnt) {
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (so.debug) {
				std::cerr << "adding literal " << getLitString(toInt(q));
			}
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			} else {
				if (so.debug) {
					std::cerr << " but already seen it";
				}
			}
			if (so.debug) {
				std::cerr << "\n";
			}
		}
	}

	oldseen.moveTo(seen);
	old_out_learnt.moveTo(out_learnt);
	old_out_learnt_level.moveTo(out_learnt_level);
}